

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O0

void __thiscall
burst::buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned_int>,_int>::
buffered_chunk_iterator
          (buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned_int>,_int> *this,
          _Fwd_list_const_iterator<unsigned_int> first,_Fwd_list_const_iterator<unsigned_int> last,
          int chunk_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  element_type *peVar4;
  int chunk_size_local;
  buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned_int>,_int> *this_local;
  _Fwd_list_const_iterator<unsigned_int> last_local;
  _Fwd_list_const_iterator<unsigned_int> first_local;
  
  (this->m_current)._M_node = first._M_node;
  (this->m_end)._M_node = last._M_node;
  this->m_chunk_size = (long)chunk_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->m_chunk_size;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,std::default_delete<unsigned_int[]>,void>
            (&this->m_chunk,pvVar3);
  peVar4 = std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->m_chunk).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>)
  ;
  this->m_chunk_end = peVar4;
  if (0 < this->m_chunk_size) {
    increment(this);
    return;
  }
  __assert_fail("m_chunk_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                ,0x4f,
                "burst::buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned int>, int>::buffered_chunk_iterator(Iterator, Iterator, Integral) [Iterator = std::_Fwd_list_const_iterator<unsigned int>, Integral = int]"
               );
}

Assistant:

buffered_chunk_iterator (Iterator first, Iterator last, Integral chunk_size):
            m_current(first),
            m_end(last),
            m_chunk_size(static_cast<difference_type>(chunk_size)),
            m_chunk
            (
                std::shared_ptr<buffer_value_type>
                (
                    new buffer_value_type[static_cast<std::size_t>(m_chunk_size)],
                    std::default_delete<buffer_value_type[]>{}
                )
            ),
            m_chunk_end(m_chunk.get())
        {
            assert(m_chunk_size > 0);
            increment();
        }